

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O0

int forkfd(int flags,pid_t *ppid)

{
  int iVar1;
  uint in_EDI;
  long in_FS_OFFSET;
  int fd;
  pid_t *in_stack_00000018;
  int system_forkfd_works;
  int in_stack_00000024;
  uint local_14;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  pid_t *ppid_00;
  
  ppid_00 = *(pid_t **)(in_FS_OFFSET + 0x28);
  iVar1 = disable_fork_fallback();
  local_14 = in_EDI;
  if (iVar1 != 0) {
    local_14 = 0;
  }
  if ((local_14 & 4) == 0) {
    iVar2 = -0x55555556;
    iVar1 = system_forkfd(fd,ppid_00,(int *)CONCAT44(0xaaaaaaaa,in_stack_fffffffffffffff0));
    if ((iVar2 != 0) || (iVar2 = disable_fork_fallback(), iVar2 != 0)) goto LAB_007d8f66;
  }
  iVar1 = forkfd_fork_fallback(in_stack_00000024,in_stack_00000018);
LAB_007d8f66:
  if (*(pid_t **)(in_FS_OFFSET + 0x28) != ppid_00) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int forkfd(int flags, pid_t *ppid)
{
    int fd;
    if (disable_fork_fallback())
        flags &= ~FFD_USE_FORK;

    if ((flags & FFD_USE_FORK) == 0) {
        int system_forkfd_works;
        fd = system_forkfd(flags, ppid, &system_forkfd_works);
        if (system_forkfd_works || disable_fork_fallback())
            return fd;
    }

    return forkfd_fork_fallback(flags, ppid);
}